

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  float fVar12;
  float fVar13;
  BaseNode *node;
  ulong uVar14;
  long lVar15;
  undefined4 uVar16;
  uint uVar17;
  ulong uVar18;
  Scene *pSVar19;
  byte bVar20;
  undefined4 uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar36;
  vint4 ai_1;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar38;
  float fVar50;
  float fVar51;
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar52;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar53;
  float fVar62;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar63;
  float fVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar77;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar92;
  vint4 bi;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar91;
  float fVar93;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  float fVar113;
  undefined1 auVar114 [16];
  float fVar121;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar119;
  float fVar120;
  undefined1 auVar118 [64];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar127 [64];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar132 [64];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [64];
  float fVar141;
  undefined1 auVar142 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar143 [64];
  float fVar147;
  float fVar148;
  undefined1 auVar149 [16];
  float fVar156;
  undefined1 auVar150 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar157;
  undefined1 auVar151 [64];
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 in_ZMM15 [64];
  undefined1 auVar159 [64];
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_a9d;
  int local_a9c;
  undefined8 local_a98;
  float fStack_a90;
  float fStack_a8c;
  undefined8 local_a88;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  float fStack_a70;
  float fStack_a6c;
  RayQueryContext *local_a60;
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  ulong *local_a00;
  long local_9f8;
  long local_9f0;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  uint local_9d0;
  uint local_9cc;
  uint local_9c8;
  RTCFilterFunctionNArguments local_9b8;
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar4 = ray->tfar;
    if (0.0 <= fVar4) {
      puVar23 = local_7d8 + 1;
      aVar5 = (ray->dir).field_0;
      auVar27 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      auVar28 = vandps_avx((undefined1  [16])aVar5,auVar28);
      auVar95._8_4_ = 0x219392ef;
      auVar95._0_8_ = 0x219392ef219392ef;
      auVar95._12_4_ = 0x219392ef;
      auVar28 = vcmpps_avx(auVar28,auVar95,1);
      auVar28 = vblendvps_avx((undefined1  [16])aVar5,auVar95,auVar28);
      auVar95 = vrcpps_avx(auVar28);
      fVar78 = auVar95._0_4_;
      auVar65._0_4_ = fVar78 * auVar28._0_4_;
      fVar87 = auVar95._4_4_;
      auVar65._4_4_ = fVar87 * auVar28._4_4_;
      fVar90 = auVar95._8_4_;
      auVar65._8_4_ = fVar90 * auVar28._8_4_;
      fVar63 = auVar95._12_4_;
      auVar65._12_4_ = fVar63 * auVar28._12_4_;
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = 0x3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar28 = vsubps_avx(auVar96,auVar65);
      auVar66._0_4_ = fVar78 + fVar78 * auVar28._0_4_;
      auVar66._4_4_ = fVar87 + fVar87 * auVar28._4_4_;
      auVar66._8_4_ = fVar90 + fVar90 * auVar28._8_4_;
      auVar66._12_4_ = fVar63 + fVar63 * auVar28._12_4_;
      uVar16 = *(undefined4 *)&(ray->org).field_0;
      local_908._4_4_ = uVar16;
      local_908._0_4_ = uVar16;
      local_908._8_4_ = uVar16;
      local_908._12_4_ = uVar16;
      auVar112 = ZEXT1664(local_908);
      uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_918._4_4_ = uVar16;
      local_918._0_4_ = uVar16;
      local_918._8_4_ = uVar16;
      local_918._12_4_ = uVar16;
      auVar118 = ZEXT1664(local_918);
      uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_928._4_4_ = uVar16;
      local_928._0_4_ = uVar16;
      local_928._8_4_ = uVar16;
      local_928._12_4_ = uVar16;
      auVar125 = ZEXT1664(local_928);
      local_938 = vshufps_avx(auVar66,auVar66,0);
      auVar127 = ZEXT1664(local_938);
      auVar28 = vmovshdup_avx(auVar66);
      local_948 = vshufps_avx(auVar66,auVar66,0x55);
      auVar132 = ZEXT1664(local_948);
      auVar95 = vshufpd_avx(auVar66,auVar66,1);
      local_958 = vshufps_avx(auVar66,auVar66,0xaa);
      auVar137 = ZEXT1664(local_958);
      uVar24 = (ulong)(auVar66._0_4_ < 0.0) << 2;
      uVar1 = (ulong)(auVar28._0_4_ < 0.0) * 4 + 8;
      uVar2 = (ulong)(auVar95._0_4_ < 0.0) * 4 + 0x10;
      uVar25 = uVar24 ^ 4;
      local_968 = vshufps_avx(auVar27,auVar27,0);
      auVar143 = ZEXT1664(local_968);
      local_978 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
      auVar151 = ZEXT1664(local_978);
      local_988 = mm_lookupmask_ps._240_16_;
      auVar28 = vpcmpeqd_avx(in_ZMM15._0_16_,in_ZMM15._0_16_);
      auVar159 = ZEXT1664(auVar28);
      local_a60 = context;
LAB_00b8948b:
      if (puVar23 != local_7d8) {
        uVar26 = puVar23[-1];
        puVar23 = puVar23 + -1;
        while ((uVar26 & 8) == 0) {
          uVar14 = uVar26 & 0xfffffffffffffff0;
          puVar22 = (ulong *)(uVar14 + 0x20);
          if (uVar14 == 0) {
            puVar22 = (ulong *)0x0;
          }
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *puVar22;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)((long)puVar22 + 4);
          auVar28 = vpminub_avx(auVar27,auVar39);
          auVar28 = vpcmpeqb_avx(auVar27,auVar28);
          auVar28 = vpmovzxbd_avx(auVar159._0_16_ ^ auVar28);
          auVar28 = vpslld_avx(auVar159._0_16_ ^ auVar28,0x1f);
          uVar16 = vmovmskps_avx(auVar28);
          fVar4 = *(float *)(puVar22 + 3);
          fVar78 = *(float *)((long)puVar22 + 0x24);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)((long)puVar22 + uVar24);
          auVar28 = vpmovzxbd_avx(auVar54);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar55._0_4_ = fVar4 + fVar78 * auVar28._0_4_;
          auVar55._4_4_ = fVar4 + fVar78 * auVar28._4_4_;
          auVar55._8_4_ = fVar4 + fVar78 * auVar28._8_4_;
          auVar55._12_4_ = fVar4 + fVar78 * auVar28._12_4_;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)((long)puVar22 + uVar25);
          auVar28 = vpmovzxbd_avx(auVar67);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar29._0_4_ = fVar4 + fVar78 * auVar28._0_4_;
          auVar29._4_4_ = fVar4 + fVar78 * auVar28._4_4_;
          auVar29._8_4_ = fVar4 + fVar78 * auVar28._8_4_;
          auVar29._12_4_ = fVar4 + fVar78 * auVar28._12_4_;
          fVar4 = *(float *)((long)puVar22 + 0x1c);
          fVar78 = *(float *)(puVar22 + 5);
          auVar81._8_8_ = 0;
          auVar81._0_8_ = *(ulong *)((long)puVar22 + uVar1);
          auVar28 = vpmovzxbd_avx(auVar81);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar82._0_4_ = fVar4 + fVar78 * auVar28._0_4_;
          auVar82._4_4_ = fVar4 + fVar78 * auVar28._4_4_;
          auVar82._8_4_ = fVar4 + fVar78 * auVar28._8_4_;
          auVar82._12_4_ = fVar4 + fVar78 * auVar28._12_4_;
          auVar97._8_8_ = 0;
          auVar97._0_8_ = *(ulong *)((long)puVar22 + (uVar1 ^ 4));
          auVar28 = vpmovzxbd_avx(auVar97);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar40._0_4_ = fVar4 + fVar78 * auVar28._0_4_;
          auVar40._4_4_ = fVar4 + fVar78 * auVar28._4_4_;
          auVar40._8_4_ = fVar4 + fVar78 * auVar28._8_4_;
          auVar40._12_4_ = fVar4 + fVar78 * auVar28._12_4_;
          fVar4 = *(float *)((long)puVar22 + 0x2c);
          auVar98._8_8_ = 0;
          auVar98._0_8_ = *(ulong *)((long)puVar22 + uVar2);
          auVar28 = vpmovzxbd_avx(auVar98);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)((long)puVar22 + (uVar2 ^ 4));
          auVar27 = vpmovzxbd_avx(auVar103);
          auVar27 = vcvtdq2ps_avx(auVar27);
          fVar78 = *(float *)(puVar22 + 4);
          auVar99._0_4_ = fVar78 + fVar4 * auVar28._0_4_;
          auVar99._4_4_ = fVar78 + fVar4 * auVar28._4_4_;
          auVar99._8_4_ = fVar78 + fVar4 * auVar28._8_4_;
          auVar99._12_4_ = fVar78 + fVar4 * auVar28._12_4_;
          auVar68._0_4_ = fVar78 + fVar4 * auVar27._0_4_;
          auVar68._4_4_ = fVar78 + fVar4 * auVar27._4_4_;
          auVar68._8_4_ = fVar78 + fVar4 * auVar27._8_4_;
          auVar68._12_4_ = fVar78 + fVar4 * auVar27._12_4_;
          auVar28 = vsubps_avx(auVar55,auVar112._0_16_);
          auVar56._0_4_ = auVar127._0_4_ * auVar28._0_4_;
          auVar56._4_4_ = auVar127._4_4_ * auVar28._4_4_;
          auVar56._8_4_ = auVar127._8_4_ * auVar28._8_4_;
          auVar56._12_4_ = auVar127._12_4_ * auVar28._12_4_;
          auVar28 = vsubps_avx(auVar82,auVar118._0_16_);
          auVar83._0_4_ = auVar132._0_4_ * auVar28._0_4_;
          auVar83._4_4_ = auVar132._4_4_ * auVar28._4_4_;
          auVar83._8_4_ = auVar132._8_4_ * auVar28._8_4_;
          auVar83._12_4_ = auVar132._12_4_ * auVar28._12_4_;
          auVar28 = vpmaxsd_avx(auVar56,auVar83);
          auVar27 = vsubps_avx(auVar99,auVar125._0_16_);
          auVar84._0_4_ = auVar137._0_4_ * auVar27._0_4_;
          auVar84._4_4_ = auVar137._4_4_ * auVar27._4_4_;
          auVar84._8_4_ = auVar137._8_4_ * auVar27._8_4_;
          auVar84._12_4_ = auVar137._12_4_ * auVar27._12_4_;
          auVar27 = vpmaxsd_avx(auVar84,auVar143._0_16_);
          auVar28 = vpmaxsd_avx(auVar28,auVar27);
          auVar27 = vsubps_avx(auVar29,auVar112._0_16_);
          auVar30._0_4_ = auVar127._0_4_ * auVar27._0_4_;
          auVar30._4_4_ = auVar127._4_4_ * auVar27._4_4_;
          auVar30._8_4_ = auVar127._8_4_ * auVar27._8_4_;
          auVar30._12_4_ = auVar127._12_4_ * auVar27._12_4_;
          auVar27 = vsubps_avx(auVar40,auVar118._0_16_);
          auVar41._0_4_ = auVar132._0_4_ * auVar27._0_4_;
          auVar41._4_4_ = auVar132._4_4_ * auVar27._4_4_;
          auVar41._8_4_ = auVar132._8_4_ * auVar27._8_4_;
          auVar41._12_4_ = auVar132._12_4_ * auVar27._12_4_;
          auVar27 = vpminsd_avx(auVar30,auVar41);
          auVar95 = vsubps_avx(auVar68,auVar125._0_16_);
          auVar42._0_4_ = auVar137._0_4_ * auVar95._0_4_;
          auVar42._4_4_ = auVar137._4_4_ * auVar95._4_4_;
          auVar42._8_4_ = auVar137._8_4_ * auVar95._8_4_;
          auVar42._12_4_ = auVar137._12_4_ * auVar95._12_4_;
          auVar95 = vpminsd_avx(auVar42,auVar151._0_16_);
          auVar27 = vpminsd_avx(auVar27,auVar95);
          auVar28 = vpcmpgtd_avx(auVar28,auVar27);
          uVar21 = vmovmskps_avx(auVar28);
          bVar20 = ~(byte)uVar21 & (byte)uVar16;
          if (bVar20 == 0) goto LAB_00b8948b;
          lVar15 = 0;
          if (bVar20 != 0) {
            for (; (bVar20 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          uVar26 = *(ulong *)(uVar14 + lVar15 * 8);
          uVar17 = bVar20 - 1 & (uint)bVar20;
          uVar18 = (ulong)uVar17;
          if (uVar17 != 0) {
            do {
              *puVar23 = uVar26;
              puVar23 = puVar23 + 1;
              lVar15 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                }
              }
              uVar26 = *(ulong *)(uVar14 + lVar15 * 8);
              uVar18 = uVar18 - 1 & uVar18;
            } while (uVar18 != 0);
          }
        }
        local_9f0 = (ulong)((uint)uVar26 & 0xf) - 8;
        uVar26 = uVar26 & 0xfffffffffffffff0;
        local_9f8 = 0;
        while (local_9f8 != local_9f0) {
          lVar15 = local_9f8 * 0x50;
          pSVar19 = context->scene;
          ppfVar6 = (pSVar19->vertices).items;
          pfVar7 = ppfVar6[*(uint *)(uVar26 + 0x30 + lVar15)];
          pfVar8 = ppfVar6[*(uint *)(uVar26 + 0x34 + lVar15)];
          pfVar9 = ppfVar6[*(uint *)(uVar26 + 0x38 + lVar15)];
          pfVar10 = ppfVar6[*(uint *)(uVar26 + 0x3c + lVar15)];
          auVar95 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + lVar15)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 8 + lVar15)));
          auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + lVar15)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar26 + 8 + lVar15)));
          auVar65 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 4 + lVar15)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 0xc + lVar15))
                                 );
          auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 4 + lVar15)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar26 + 0xc + lVar15))
                                 );
          auVar96 = vunpcklps_avx(auVar28,auVar27);
          auVar29 = vunpcklps_avx(auVar95,auVar65);
          auVar28 = vunpckhps_avx(auVar95,auVar65);
          auVar65 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x10 + lVar15))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar26 + 0x18 + lVar15)));
          auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x10 + lVar15))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar26 + 0x18 + lVar15)));
          auVar66 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x14 + lVar15))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar26 + 0x1c + lVar15)));
          auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x14 + lVar15))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar26 + 0x1c + lVar15)));
          auVar30 = vunpcklps_avx(auVar27,auVar95);
          auVar39 = vunpcklps_avx(auVar65,auVar66);
          auVar27 = vunpckhps_avx(auVar65,auVar66);
          auVar66 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x20 + lVar15))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar26 + 0x28 + lVar15)));
          auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 0x20 + lVar15))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar26 + 0x28 + lVar15)));
          auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x24 + lVar15))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar26 + 0x2c + lVar15)));
          auVar65 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 0x24 + lVar15))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar26 + 0x2c + lVar15)));
          auVar41 = vunpcklps_avx(auVar95,auVar65);
          auVar65 = vunpcklps_avx(auVar66,auVar40);
          auVar66 = vunpckhps_avx(auVar66,auVar40);
          puVar3 = (undefined8 *)(uVar26 + 0x30 + lVar15);
          local_898 = *puVar3;
          uStack_890 = puVar3[1];
          puVar3 = (undefined8 *)(uVar26 + 0x40 + lVar15);
          local_8a8 = *puVar3;
          uStack_8a0 = puVar3[1];
          uVar16 = *(undefined4 *)&(ray->org).field_0;
          auVar122._4_4_ = uVar16;
          auVar122._0_4_ = uVar16;
          auVar122._8_4_ = uVar16;
          auVar122._12_4_ = uVar16;
          uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar142._4_4_ = uVar16;
          auVar142._0_4_ = uVar16;
          auVar142._8_4_ = uVar16;
          auVar142._12_4_ = uVar16;
          uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar149._4_4_ = uVar16;
          auVar149._0_4_ = uVar16;
          auVar149._8_4_ = uVar16;
          auVar149._12_4_ = uVar16;
          local_a18 = vsubps_avx(auVar29,auVar122);
          local_a28 = vsubps_avx(auVar28,auVar142);
          local_a38 = vsubps_avx(auVar96,auVar149);
          auVar28 = vsubps_avx(auVar39,auVar122);
          auVar27 = vsubps_avx(auVar27,auVar142);
          auVar95 = vsubps_avx(auVar30,auVar149);
          auVar65 = vsubps_avx(auVar65,auVar122);
          auVar66 = vsubps_avx(auVar66,auVar142);
          auVar96 = vsubps_avx(auVar41,auVar149);
          local_a48 = vsubps_avx(auVar65,local_a18);
          local_a58 = vsubps_avx(auVar66,local_a28);
          local_8b8 = vsubps_avx(auVar96,local_a38);
          fVar4 = local_a28._0_4_;
          fVar38 = auVar66._0_4_ + fVar4;
          fVar87 = local_a28._4_4_;
          fVar50 = auVar66._4_4_ + fVar87;
          fVar63 = local_a28._8_4_;
          fVar51 = auVar66._8_4_ + fVar63;
          fVar12 = local_a28._12_4_;
          fVar52 = auVar66._12_4_ + fVar12;
          fVar126 = local_a38._0_4_;
          fVar79 = fVar126 + auVar96._0_4_;
          fVar128 = local_a38._4_4_;
          fVar88 = fVar128 + auVar96._4_4_;
          fVar129 = local_a38._8_4_;
          fVar91 = fVar129 + auVar96._8_4_;
          fVar130 = local_a38._12_4_;
          fVar93 = fVar130 + auVar96._12_4_;
          fVar53 = local_8b8._0_4_;
          auVar114._0_4_ = fVar53 * fVar38;
          fVar62 = local_8b8._4_4_;
          auVar114._4_4_ = fVar62 * fVar50;
          fVar36 = local_8b8._8_4_;
          auVar114._8_4_ = fVar36 * fVar51;
          fVar37 = local_8b8._12_4_;
          auVar114._12_4_ = fVar37 * fVar52;
          fVar158 = local_a58._0_4_;
          auVar123._0_4_ = fVar158 * fVar79;
          fVar160 = local_a58._4_4_;
          auVar123._4_4_ = fVar160 * fVar88;
          fVar161 = local_a58._8_4_;
          auVar123._8_4_ = fVar161 * fVar91;
          fVar162 = local_a58._12_4_;
          auVar123._12_4_ = fVar162 * fVar93;
          auVar29 = vsubps_avx(auVar123,auVar114);
          fVar78 = local_a18._0_4_;
          fVar113 = auVar65._0_4_ + fVar78;
          fVar90 = local_a18._4_4_;
          fVar119 = auVar65._4_4_ + fVar90;
          fVar64 = local_a18._8_4_;
          fVar120 = auVar65._8_4_ + fVar64;
          fVar13 = local_a18._12_4_;
          fVar121 = auVar65._12_4_ + fVar13;
          fVar147 = local_a48._0_4_;
          auVar85._0_4_ = fVar147 * fVar79;
          fVar152 = local_a48._4_4_;
          auVar85._4_4_ = fVar152 * fVar88;
          fVar154 = local_a48._8_4_;
          auVar85._8_4_ = fVar154 * fVar91;
          fVar156 = local_a48._12_4_;
          auVar85._12_4_ = fVar156 * fVar93;
          auVar124._0_4_ = fVar113 * fVar53;
          auVar124._4_4_ = fVar119 * fVar62;
          auVar124._8_4_ = fVar120 * fVar36;
          auVar124._12_4_ = fVar121 * fVar37;
          auVar30 = vsubps_avx(auVar124,auVar85);
          auVar115._0_4_ = fVar158 * fVar113;
          auVar115._4_4_ = fVar160 * fVar119;
          auVar115._8_4_ = fVar161 * fVar120;
          auVar115._12_4_ = fVar162 * fVar121;
          auVar31._0_4_ = fVar147 * fVar38;
          auVar31._4_4_ = fVar152 * fVar50;
          auVar31._8_4_ = fVar154 * fVar51;
          auVar31._12_4_ = fVar156 * fVar52;
          auVar39 = vsubps_avx(auVar31,auVar115);
          local_a88._4_4_ = (ray->dir).field_0.m128[2];
          local_a98._4_4_ = (ray->dir).field_0.m128[1];
          fStack_a70 = (ray->dir).field_0.m128[0];
          local_a78 = (RTCIntersectArguments *)CONCAT44(fStack_a70,fStack_a70);
          fStack_a6c = fStack_a70;
          local_8d8._0_4_ =
               auVar29._0_4_ * fStack_a70 +
               local_a98._4_4_ * auVar30._0_4_ + local_a88._4_4_ * auVar39._0_4_;
          local_8d8._4_4_ =
               auVar29._4_4_ * fStack_a70 +
               local_a98._4_4_ * auVar30._4_4_ + local_a88._4_4_ * auVar39._4_4_;
          local_8d8._8_4_ =
               auVar29._8_4_ * fStack_a70 +
               local_a98._4_4_ * auVar30._8_4_ + local_a88._4_4_ * auVar39._8_4_;
          local_8d8._12_4_ =
               auVar29._12_4_ * fStack_a70 +
               local_a98._4_4_ * auVar30._12_4_ + local_a88._4_4_ * auVar39._12_4_;
          local_8c8 = vsubps_avx(local_a28,auVar27);
          auVar29 = vsubps_avx(local_a38,auVar95);
          fVar38 = fVar4 + auVar27._0_4_;
          fVar50 = fVar87 + auVar27._4_4_;
          fVar51 = fVar63 + auVar27._8_4_;
          fVar52 = fVar12 + auVar27._12_4_;
          fVar79 = fVar126 + auVar95._0_4_;
          fVar88 = fVar128 + auVar95._4_4_;
          fVar91 = fVar129 + auVar95._8_4_;
          fVar93 = fVar130 + auVar95._12_4_;
          fVar131 = auVar29._0_4_;
          auVar150._0_4_ = fVar131 * fVar38;
          fVar133 = auVar29._4_4_;
          auVar150._4_4_ = fVar133 * fVar50;
          fVar134 = auVar29._8_4_;
          auVar150._8_4_ = fVar134 * fVar51;
          fVar135 = auVar29._12_4_;
          auVar150._12_4_ = fVar135 * fVar52;
          fVar141 = local_8c8._0_4_;
          auVar69._0_4_ = fVar141 * fVar79;
          fVar144 = local_8c8._4_4_;
          auVar69._4_4_ = fVar144 * fVar88;
          fVar145 = local_8c8._8_4_;
          auVar69._8_4_ = fVar145 * fVar91;
          fVar146 = local_8c8._12_4_;
          auVar69._12_4_ = fVar146 * fVar93;
          auVar29 = vsubps_avx(auVar69,auVar150);
          auVar30 = vsubps_avx(local_a18,auVar28);
          fVar148 = auVar30._0_4_;
          auVar86._0_4_ = fVar148 * fVar79;
          fVar153 = auVar30._4_4_;
          auVar86._4_4_ = fVar153 * fVar88;
          fVar155 = auVar30._8_4_;
          auVar86._8_4_ = fVar155 * fVar91;
          fVar157 = auVar30._12_4_;
          auVar86._12_4_ = fVar157 * fVar93;
          fVar79 = fVar78 + auVar28._0_4_;
          fVar88 = fVar90 + auVar28._4_4_;
          fVar91 = fVar64 + auVar28._8_4_;
          fVar93 = fVar13 + auVar28._12_4_;
          auVar116._0_4_ = fVar131 * fVar79;
          auVar116._4_4_ = fVar133 * fVar88;
          auVar116._8_4_ = fVar134 * fVar91;
          auVar116._12_4_ = fVar135 * fVar93;
          auVar30 = vsubps_avx(auVar116,auVar86);
          auVar107._0_4_ = fVar141 * fVar79;
          auVar107._4_4_ = fVar144 * fVar88;
          auVar107._8_4_ = fVar145 * fVar91;
          auVar107._12_4_ = fVar146 * fVar93;
          auVar32._0_4_ = fVar148 * fVar38;
          auVar32._4_4_ = fVar153 * fVar50;
          auVar32._8_4_ = fVar155 * fVar51;
          auVar32._12_4_ = fVar157 * fVar52;
          auVar39 = vsubps_avx(auVar32,auVar107);
          local_878._0_4_ =
               fStack_a70 * auVar29._0_4_ +
               local_a98._4_4_ * auVar30._0_4_ + local_a88._4_4_ * auVar39._0_4_;
          local_878._4_4_ =
               fStack_a70 * auVar29._4_4_ +
               local_a98._4_4_ * auVar30._4_4_ + local_a88._4_4_ * auVar39._4_4_;
          local_878._8_4_ =
               fStack_a70 * auVar29._8_4_ +
               local_a98._4_4_ * auVar30._8_4_ + local_a88._4_4_ * auVar39._8_4_;
          local_878._12_4_ =
               fStack_a70 * auVar29._12_4_ +
               local_a98._4_4_ * auVar30._12_4_ + local_a88._4_4_ * auVar39._12_4_;
          auVar29 = vsubps_avx(auVar28,auVar65);
          fVar119 = auVar65._0_4_ + auVar28._0_4_;
          fVar120 = auVar65._4_4_ + auVar28._4_4_;
          fVar121 = auVar65._8_4_ + auVar28._8_4_;
          fVar77 = auVar65._12_4_ + auVar28._12_4_;
          auVar28 = vsubps_avx(auVar27,auVar66);
          fVar88 = auVar27._0_4_ + auVar66._0_4_;
          fVar91 = auVar27._4_4_ + auVar66._4_4_;
          fVar93 = auVar27._8_4_ + auVar66._8_4_;
          fVar113 = auVar27._12_4_ + auVar66._12_4_;
          auVar27 = vsubps_avx(auVar95,auVar96);
          fVar50 = auVar95._0_4_ + auVar96._0_4_;
          fVar51 = auVar95._4_4_ + auVar96._4_4_;
          fVar52 = auVar95._8_4_ + auVar96._8_4_;
          fVar79 = auVar95._12_4_ + auVar96._12_4_;
          fVar80 = auVar27._0_4_;
          auVar100._0_4_ = fVar80 * fVar88;
          fVar89 = auVar27._4_4_;
          auVar100._4_4_ = fVar89 * fVar91;
          fVar92 = auVar27._8_4_;
          auVar100._8_4_ = fVar92 * fVar93;
          fVar94 = auVar27._12_4_;
          auVar100._12_4_ = fVar94 * fVar113;
          fVar136 = auVar28._0_4_;
          auVar108._0_4_ = fVar136 * fVar50;
          fVar138 = auVar28._4_4_;
          auVar108._4_4_ = fVar138 * fVar51;
          fVar139 = auVar28._8_4_;
          auVar108._8_4_ = fVar139 * fVar52;
          fVar140 = auVar28._12_4_;
          auVar108._12_4_ = fVar140 * fVar79;
          auVar28 = vsubps_avx(auVar108,auVar100);
          fVar38 = auVar29._0_4_;
          auVar43._0_4_ = fVar38 * fVar50;
          fVar50 = auVar29._4_4_;
          auVar43._4_4_ = fVar50 * fVar51;
          fVar51 = auVar29._8_4_;
          auVar43._8_4_ = fVar51 * fVar52;
          fVar52 = auVar29._12_4_;
          auVar43._12_4_ = fVar52 * fVar79;
          auVar109._0_4_ = fVar80 * fVar119;
          auVar109._4_4_ = fVar89 * fVar120;
          auVar109._8_4_ = fVar92 * fVar121;
          auVar109._12_4_ = fVar94 * fVar77;
          auVar27 = vsubps_avx(auVar109,auVar43);
          auVar70._0_4_ = fVar136 * fVar119;
          auVar70._4_4_ = fVar138 * fVar120;
          auVar70._8_4_ = fVar139 * fVar121;
          auVar70._12_4_ = fVar140 * fVar77;
          auVar57._0_4_ = fVar38 * fVar88;
          auVar57._4_4_ = fVar50 * fVar91;
          auVar57._8_4_ = fVar51 * fVar93;
          auVar57._12_4_ = fVar52 * fVar113;
          auVar95 = vsubps_avx(auVar57,auVar70);
          local_a88._0_4_ = local_a88._4_4_;
          fStack_a80 = local_a88._4_4_;
          fStack_a7c = local_a88._4_4_;
          local_a98._0_4_ = local_a98._4_4_;
          fStack_a90 = local_a98._4_4_;
          fStack_a8c = local_a98._4_4_;
          auVar44._0_4_ =
               fStack_a70 * auVar28._0_4_ +
               local_a98._4_4_ * auVar27._0_4_ + local_a88._4_4_ * auVar95._0_4_;
          auVar44._4_4_ =
               fStack_a70 * auVar28._4_4_ +
               local_a98._4_4_ * auVar27._4_4_ + local_a88._4_4_ * auVar95._4_4_;
          auVar44._8_4_ =
               fStack_a70 * auVar28._8_4_ +
               local_a98._4_4_ * auVar27._8_4_ + local_a88._4_4_ * auVar95._8_4_;
          auVar44._12_4_ =
               fStack_a70 * auVar28._12_4_ +
               local_a98._4_4_ * auVar27._12_4_ + local_a88._4_4_ * auVar95._12_4_;
          local_868._0_4_ = auVar44._0_4_ + local_8d8._0_4_ + local_878._0_4_;
          local_868._4_4_ = auVar44._4_4_ + local_8d8._4_4_ + local_878._4_4_;
          local_868._8_4_ = auVar44._8_4_ + local_8d8._8_4_ + local_878._8_4_;
          local_868._12_4_ = auVar44._12_4_ + local_8d8._12_4_ + local_878._12_4_;
          auVar28 = vminps_avx(local_8d8,local_878);
          auVar28 = vminps_avx(auVar28,auVar44);
          auVar71._8_4_ = 0x7fffffff;
          auVar71._0_8_ = 0x7fffffff7fffffff;
          auVar71._12_4_ = 0x7fffffff;
          auVar112 = ZEXT1664(auVar71);
          local_8e8 = vandps_avx(local_868,auVar71);
          auVar72._0_4_ = local_8e8._0_4_ * 1.1920929e-07;
          auVar72._4_4_ = local_8e8._4_4_ * 1.1920929e-07;
          auVar72._8_4_ = local_8e8._8_4_ * 1.1920929e-07;
          auVar72._12_4_ = local_8e8._12_4_ * 1.1920929e-07;
          uVar14 = CONCAT44(auVar72._4_4_,auVar72._0_4_);
          auVar101._0_8_ = uVar14 ^ 0x8000000080000000;
          auVar101._8_4_ = -auVar72._8_4_;
          auVar101._12_4_ = -auVar72._12_4_;
          auVar28 = vcmpps_avx(auVar28,auVar101,5);
          auVar27 = vmaxps_avx(local_8d8,local_878);
          auVar27 = vmaxps_avx(auVar27,auVar44);
          auVar27 = vcmpps_avx(auVar27,auVar72,2);
          local_8f8 = vorps_avx(auVar28,auVar27);
          local_a9d = 0;
          auVar28 = local_988 & local_8f8;
          if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar28[0xf] < '\0') {
            auVar45._0_4_ = fVar141 * fVar53;
            auVar45._4_4_ = fVar144 * fVar62;
            auVar45._8_4_ = fVar145 * fVar36;
            auVar45._12_4_ = fVar146 * fVar37;
            auVar58._0_4_ = fVar158 * fVar131;
            auVar58._4_4_ = fVar160 * fVar133;
            auVar58._8_4_ = fVar161 * fVar134;
            auVar58._12_4_ = fVar162 * fVar135;
            auVar95 = vsubps_avx(auVar58,auVar45);
            auVar73._0_4_ = fVar131 * fVar136;
            auVar73._4_4_ = fVar133 * fVar138;
            auVar73._8_4_ = fVar134 * fVar139;
            auVar73._12_4_ = fVar135 * fVar140;
            auVar102._0_4_ = fVar141 * fVar80;
            auVar102._4_4_ = fVar144 * fVar89;
            auVar102._8_4_ = fVar145 * fVar92;
            auVar102._12_4_ = fVar146 * fVar94;
            auVar65 = vsubps_avx(auVar102,auVar73);
            auVar28 = vandps_avx(auVar71,auVar45);
            auVar27 = vandps_avx(auVar71,auVar73);
            auVar28 = vcmpps_avx(auVar28,auVar27,1);
            local_808 = vblendvps_avx(auVar65,auVar95,auVar28);
            auVar46._0_4_ = fVar148 * fVar80;
            auVar46._4_4_ = fVar153 * fVar89;
            auVar46._8_4_ = fVar155 * fVar92;
            auVar46._12_4_ = fVar157 * fVar94;
            auVar59._0_4_ = fVar148 * fVar53;
            auVar59._4_4_ = fVar153 * fVar62;
            auVar59._8_4_ = fVar155 * fVar36;
            auVar59._12_4_ = fVar157 * fVar37;
            auVar74._0_4_ = fVar131 * fVar147;
            auVar74._4_4_ = fVar133 * fVar152;
            auVar74._8_4_ = fVar134 * fVar154;
            auVar74._12_4_ = fVar135 * fVar156;
            auVar95 = vsubps_avx(auVar59,auVar74);
            auVar104._0_4_ = fVar131 * fVar38;
            auVar104._4_4_ = fVar133 * fVar50;
            auVar104._8_4_ = fVar134 * fVar51;
            auVar104._12_4_ = fVar135 * fVar52;
            auVar65 = vsubps_avx(auVar104,auVar46);
            auVar28 = vandps_avx(auVar71,auVar74);
            auVar27 = vandps_avx(auVar71,auVar46);
            auVar28 = vcmpps_avx(auVar28,auVar27,1);
            local_7f8 = vblendvps_avx(auVar65,auVar95,auVar28);
            auVar33._0_4_ = fVar141 * fVar38;
            auVar33._4_4_ = fVar144 * fVar50;
            auVar33._8_4_ = fVar145 * fVar51;
            auVar33._12_4_ = fVar146 * fVar52;
            auVar60._0_4_ = fVar141 * fVar147;
            auVar60._4_4_ = fVar144 * fVar152;
            auVar60._8_4_ = fVar145 * fVar154;
            auVar60._12_4_ = fVar146 * fVar156;
            auVar75._0_4_ = fVar158 * fVar148;
            auVar75._4_4_ = fVar160 * fVar153;
            auVar75._8_4_ = fVar161 * fVar155;
            auVar75._12_4_ = fVar162 * fVar157;
            auVar105._0_4_ = fVar148 * fVar136;
            auVar105._4_4_ = fVar153 * fVar138;
            auVar105._8_4_ = fVar155 * fVar139;
            auVar105._12_4_ = fVar157 * fVar140;
            auVar95 = vsubps_avx(auVar60,auVar75);
            auVar65 = vsubps_avx(auVar105,auVar33);
            auVar28 = vandps_avx(auVar71,auVar75);
            auVar27 = vandps_avx(auVar71,auVar33);
            auVar28 = vcmpps_avx(auVar28,auVar27,1);
            local_7e8 = vblendvps_avx(auVar65,auVar95,auVar28);
            fVar53 = local_808._0_4_ * fStack_a70 +
                     local_7f8._0_4_ * local_a98._4_4_ + local_7e8._0_4_ * local_a88._4_4_;
            fVar38 = local_808._4_4_ * fStack_a70 +
                     local_7f8._4_4_ * local_a98._4_4_ + local_7e8._4_4_ * local_a88._4_4_;
            fVar62 = local_808._8_4_ * fStack_a70 +
                     local_7f8._8_4_ * local_a98._4_4_ + local_7e8._8_4_ * local_a88._4_4_;
            fVar50 = local_808._12_4_ * fStack_a70 +
                     local_7f8._12_4_ * local_a98._4_4_ + local_7e8._12_4_ * local_a88._4_4_;
            auVar76._0_4_ = fVar53 + fVar53;
            auVar76._4_4_ = fVar38 + fVar38;
            auVar76._8_4_ = fVar62 + fVar62;
            auVar76._12_4_ = fVar50 + fVar50;
            fVar53 = local_808._0_4_ * fVar78 + local_7f8._0_4_ * fVar4 + local_7e8._0_4_ * fVar126;
            fVar38 = local_808._4_4_ * fVar90 + local_7f8._4_4_ * fVar87 + local_7e8._4_4_ * fVar128
            ;
            fVar63 = local_808._8_4_ * fVar64 + local_7f8._8_4_ * fVar63 + local_7e8._8_4_ * fVar129
            ;
            fVar64 = local_808._12_4_ * fVar13 +
                     local_7f8._12_4_ * fVar12 + local_7e8._12_4_ * fVar130;
            auVar28 = vrcpps_avx(auVar76);
            fVar4 = auVar28._0_4_;
            auVar110._0_4_ = auVar76._0_4_ * fVar4;
            fVar78 = auVar28._4_4_;
            auVar110._4_4_ = auVar76._4_4_ * fVar78;
            fVar87 = auVar28._8_4_;
            auVar110._8_4_ = auVar76._8_4_ * fVar87;
            fVar90 = auVar28._12_4_;
            auVar110._12_4_ = auVar76._12_4_ * fVar90;
            auVar117._8_4_ = 0x3f800000;
            auVar117._0_8_ = 0x3f8000003f800000;
            auVar117._12_4_ = 0x3f800000;
            auVar28 = vsubps_avx(auVar117,auVar110);
            local_818._0_4_ = (fVar53 + fVar53) * (fVar4 + fVar4 * auVar28._0_4_);
            local_818._4_4_ = (fVar38 + fVar38) * (fVar78 + fVar78 * auVar28._4_4_);
            local_818._8_4_ = (fVar63 + fVar63) * (fVar87 + fVar87 * auVar28._8_4_);
            local_818._12_4_ = (fVar64 + fVar64) * (fVar90 + fVar90 * auVar28._12_4_);
            uVar16 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar106._4_4_ = uVar16;
            auVar106._0_4_ = uVar16;
            auVar106._8_4_ = uVar16;
            auVar106._12_4_ = uVar16;
            auVar28 = vcmpps_avx(auVar106,local_818,2);
            fVar4 = ray->tfar;
            auVar111._4_4_ = fVar4;
            auVar111._0_4_ = fVar4;
            auVar111._8_4_ = fVar4;
            auVar111._12_4_ = fVar4;
            auVar27 = vcmpps_avx(local_818,auVar111,2);
            auVar28 = vandps_avx(auVar28,auVar27);
            auVar27 = vcmpps_avx(auVar76,_DAT_01f45a50,4);
            auVar28 = vandps_avx(auVar27,auVar28);
            auVar27 = vpand_avx(local_8f8,local_988);
            auVar28 = vpslld_avx(auVar28,0x1f);
            auVar28 = vpsrad_avx(auVar28,0x1f);
            local_848 = vpand_avx(auVar28,auVar27);
            uVar17 = vmovmskps_avx(local_848);
            if (uVar17 != 0) {
              local_888 = local_8d8;
              local_858 = &local_a9d;
              auVar28 = vrcpps_avx(local_868);
              fVar4 = auVar28._0_4_;
              auVar47._0_4_ = local_868._0_4_ * fVar4;
              fVar78 = auVar28._4_4_;
              auVar47._4_4_ = local_868._4_4_ * fVar78;
              fVar87 = auVar28._8_4_;
              auVar47._8_4_ = local_868._8_4_ * fVar87;
              fVar90 = auVar28._12_4_;
              auVar47._12_4_ = local_868._12_4_ * fVar90;
              auVar61._8_4_ = 0x3f800000;
              auVar61._0_8_ = 0x3f8000003f800000;
              auVar61._12_4_ = 0x3f800000;
              auVar28 = vsubps_avx(auVar61,auVar47);
              auVar34._0_4_ = fVar4 + fVar4 * auVar28._0_4_;
              auVar34._4_4_ = fVar78 + fVar78 * auVar28._4_4_;
              auVar34._8_4_ = fVar87 + fVar87 * auVar28._8_4_;
              auVar34._12_4_ = fVar90 + fVar90 * auVar28._12_4_;
              auVar48._8_4_ = 0x219392ef;
              auVar48._0_8_ = 0x219392ef219392ef;
              auVar48._12_4_ = 0x219392ef;
              auVar28 = vcmpps_avx(local_8e8,auVar48,5);
              auVar28 = vandps_avx(auVar28,auVar34);
              auVar49._0_4_ = local_8d8._0_4_ * auVar28._0_4_;
              auVar49._4_4_ = local_8d8._4_4_ * auVar28._4_4_;
              auVar49._8_4_ = local_8d8._8_4_ * auVar28._8_4_;
              auVar49._12_4_ = local_8d8._12_4_ * auVar28._12_4_;
              local_838 = vminps_avx(auVar49,auVar61);
              auVar35._0_4_ = local_878._0_4_ * auVar28._0_4_;
              auVar35._4_4_ = local_878._4_4_ * auVar28._4_4_;
              auVar35._8_4_ = local_878._8_4_ * auVar28._8_4_;
              auVar35._12_4_ = local_878._12_4_ * auVar28._12_4_;
              local_828 = vminps_avx(auVar35,auVar61);
              uVar14 = (ulong)(uVar17 & 0xff);
              local_a00 = puVar23;
              do {
                uVar18 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                local_9d0 = *(uint *)((long)&local_898 + uVar18 * 4);
                pGVar11 = (pSVar19->geometries).items[local_9d0].ptr;
                if ((pGVar11->mask & ray->mask) == 0) {
                  uVar14 = uVar14 ^ 1L << (uVar18 & 0x3f);
                }
                else {
                  local_a78 = local_a60->args;
                  if ((local_a60->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b89e6d;
                  local_a28._0_8_ = uVar14;
                  local_a18._0_8_ = pSVar19;
                  local_a88 = uVar24;
                  local_9b8.context = local_a60->user;
                  local_9e8 = *(undefined4 *)(local_808 + uVar18 * 4);
                  local_9e4 = *(undefined4 *)(local_7f8 + uVar18 * 4);
                  local_9e0 = *(undefined4 *)(local_7e8 + uVar18 * 4);
                  local_9dc = *(undefined4 *)(local_838 + uVar18 * 4);
                  local_9d8 = *(undefined4 *)(local_828 + uVar18 * 4);
                  local_9d4 = *(undefined4 *)((long)&local_8a8 + uVar18 * 4);
                  local_9cc = (local_9b8.context)->instID[0];
                  local_9c8 = (local_9b8.context)->instPrimID[0];
                  local_a48._0_4_ = ray->tfar;
                  local_a38._0_8_ = uVar18;
                  ray->tfar = *(float *)(local_818 + uVar18 * 4);
                  local_a9c = -1;
                  local_9b8.valid = &local_a9c;
                  local_9b8.geometryUserPtr = pGVar11->userPtr;
                  local_a98 = ray;
                  local_9b8.hit = (RTCHitN *)&local_9e8;
                  local_9b8.N = 1;
                  local_a58._0_8_ = pGVar11;
                  local_9b8.ray = (RTCRayN *)ray;
                  if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar11->occlusionFilterN)(&local_9b8), *local_9b8.valid != 0)) {
                    ray = local_a98;
                    if ((local_a78->filter == (RTCFilterFunctionN)0x0) ||
                       (((local_a78->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        ((*(byte *)(local_a58._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00b89e6d:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    (*local_a78->filter)(&local_9b8);
                    ray = local_a98;
                    if (*local_9b8.valid != 0) goto LAB_00b89e6d;
                  }
                  local_a98->tfar = (float)local_a48._0_4_;
                  uVar14 = local_a28._0_8_ ^ 1L << (local_a38._0_8_ & 0x3f);
                  pSVar19 = (Scene *)local_a18._0_8_;
                  ray = local_a98;
                  puVar23 = local_a00;
                  uVar24 = local_a88;
                }
                auVar71 = auVar112._0_16_;
              } while (uVar14 != 0);
            }
          }
          local_9f8 = local_9f8 + 1;
          auVar112 = ZEXT1664(local_908);
          auVar118 = ZEXT1664(local_918);
          auVar125 = ZEXT1664(local_928);
          auVar127 = ZEXT1664(local_938);
          auVar132 = ZEXT1664(local_948);
          auVar137 = ZEXT1664(local_958);
          auVar143 = ZEXT1664(local_968);
          auVar151 = ZEXT1664(local_978);
          auVar28 = vpcmpeqd_avx(auVar71,auVar71);
          auVar159 = ZEXT1664(auVar28);
          context = local_a60;
        }
        goto LAB_00b8948b;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }